

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bad_alloc *anon_var_0;
  string local_2120 [55];
  allocator local_20e9;
  string local_20e8 [32];
  _union_1457 _Stack_20c8;
  sigaction sa;
  int opt;
  bool allIntensityBinsCheck;
  bool validationCheck;
  bool zip;
  bool useIndexFile;
  char idxFileName [4096];
  char binFileName [4096];
  int local_1c;
  int maxDamageBinIdx;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  local_1c = -1;
  memcpy(idxFileName + 0xff8,"vulnerability.bin",0x1000);
  memcpy(&opt,"vulnerability.idx",0x1000);
  sa.sa_restorer._7_1_ = 0;
  sa.sa_restorer._6_1_ = 0;
  sa.sa_restorer._5_1_ = 1;
  sa.sa_restorer._4_1_ = 1;
  do {
    sa.sa_restorer._0_4_ = getopt(argc,argv,"d:izNShv");
    if ((int)sa.sa_restorer == -1) {
      if (local_1c == -1) {
        fprintf(_stderr,"ERROR: Damage bin parameter not supplied.\n");
        exit(1);
      }
      if ((sa.sa_restorer._6_1_ & 1) != 0) {
        if ((sa.sa_restorer._7_1_ & 1) != 0) {
          fprintf(_stderr,"INFO: Index files are always created when zip output is requested.\n");
        }
        sa.sa_restorer._7_1_ = sa.sa_restorer._6_1_ & 1;
      }
      sa.sa_mask.__val[0xe] = 0;
      sa.sa_mask.__val[0xf] = 0;
      sa.sa_mask.__val[0xc] = 0;
      sa.sa_mask.__val[0xd] = 0;
      sa.sa_mask.__val[10] = 0;
      sa.sa_mask.__val[0xb] = 0;
      sa.sa_mask.__val[8] = 0;
      sa.sa_mask.__val[9] = 0;
      sa.sa_mask.__val[6] = 0;
      sa.sa_mask.__val[7] = 0;
      sa.sa_mask.__val[4] = 0;
      sa.sa_mask.__val[5] = 0;
      sa.sa_mask.__val[2] = 0;
      sa.sa_mask.__val[3] = 0;
      sa.sa_mask.__val[0] = 0;
      sa.sa_mask.__val[1] = 0;
      _Stack_20c8.sa_handler = (__sighandler_t)0x0;
      sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
      sa.sa_flags = 0;
      sa._140_4_ = 0;
      sigemptyset((sigset_t *)&sa);
      _Stack_20c8.sa_handler = SegFaultSigAction;
      sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
      sigaction(0xb,(sigaction *)&_Stack_20c8,(sigaction *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20e8,"",&local_20e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2120,"",(allocator *)((long)&anon_var_0 + 7));
      initstreams((string *)local_20e8,(string *)local_2120);
      std::__cxx11::string::~string(local_2120);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      std::__cxx11::string::~string(local_20e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_20e9);
      DoIt(local_1c,idxFileName + 0xff8,(char *)&opt,(bool)(sa.sa_restorer._7_1_ & 1),
           (bool)(sa.sa_restorer._6_1_ & 1),(bool)(sa.sa_restorer._5_1_ & 1),
           (bool)(sa.sa_restorer._4_1_ & 1));
      return 0;
    }
    switch((int)sa.sa_restorer) {
    case 0x4e:
      sa.sa_restorer._5_1_ = 0;
      break;
    case 0x53:
      sa.sa_restorer._4_1_ = 0;
      break;
    case 100:
      local_1c = atoi(_optarg);
      break;
    case 0x68:
    default:
      Help();
      exit(1);
    case 0x69:
      sa.sa_restorer._7_1_ = 1;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version : %s\n",*argv,"");
      exit(1);
    case 0x7a:
      sa.sa_restorer._6_1_ = 1;
      strcat(idxFileName + 0xff8,".z");
      strcat((char *)&opt,".z");
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  int maxDamageBinIdx = -1;
  char binFileName[4096] = "vulnerability.bin";
  char idxFileName[4096] = "vulnerability.idx";
  bool useIndexFile = false;
  bool zip = false;
  bool validationCheck = true;
  bool allIntensityBinsCheck = true;
  int opt;
  while ((opt = getopt(argc, argv, "d:izNShv")) != -1) {
    switch (opt) {
      case 'd':
        maxDamageBinIdx = atoi(optarg);
	break;
      case 'i':
	useIndexFile = true;
	break;
      case 'z':
	zip = true;
        strcat(binFileName, ".z");
	strcat(idxFileName, ".z");
	break;
      case 'N':
	validationCheck = false;
	break;
      case 'S':
	allIntensityBinsCheck = false;
	break;
      case 'v':
	fprintf(stderr, "%s : version : %s\n", argv[0], VERSION);
        exit(EXIT_FAILURE);
      case 'h':
      default:
	Help();
	exit(EXIT_FAILURE);
    }
  }

  if (maxDamageBinIdx == -1) {
    fprintf(stderr, "ERROR: Damage bin parameter not supplied.\n");
    exit(EXIT_FAILURE);
  }

  // There is no need for user to give command line argument for index file
  // creation when zip output is requested.
  if (zip) {
    if (useIndexFile) {
      fprintf(stderr, "INFO: Index files are always created when zip output is"
		      " requested.\n");
    }
    useIndexFile = zip;   // Ensure downstream conditionals work
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = SegFaultSigAction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {

    initstreams();
    DoIt(maxDamageBinIdx, binFileName, idxFileName, useIndexFile, zip,
	 validationCheck, allIntensityBinsCheck);
    return 0;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "ERROR: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);

  }

}